

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sync_common.hpp
# Opt level: O0

void __thiscall
oqpi::global_sync_object<oqpi::posix_semaphore>::global_sync_object<int&,int&>
          (global_sync_object<oqpi::posix_semaphore> *this,string *name,
          sync_object_creation_options creationOption,int *args,int *args_1)

{
  int *args_local_1;
  int *args_local;
  sync_object_creation_options creationOption_local;
  string *name_local;
  global_sync_object<oqpi::posix_semaphore> *this_local;
  
  posix_semaphore::posix_semaphore(&this->super_posix_semaphore,name,creationOption,*args,*args_1);
  std::__cxx11::string::string((string *)&this->name_,(string *)name);
  return;
}

Assistant:

global_sync_object(const std::string &name, sync_object_creation_options creationOption, _Args &&...args)
            : _Impl(name, creationOption, std::forward<_Args>(args)...)
            , name_(name)
        {}